

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O1

void png_convert_from_time_t(png_timep ptime,time_t ttime)

{
  tm *ptVar1;
  time_t local_10;
  
  local_10 = ttime;
  ptVar1 = gmtime(&local_10);
  ptime->year = (short)ptVar1->tm_year + 0x76c;
  ptime->month = (char)ptVar1->tm_mon + '\x01';
  ptime->day = (png_byte)ptVar1->tm_mday;
  ptime->hour = (png_byte)ptVar1->tm_hour;
  ptime->minute = (png_byte)ptVar1->tm_min;
  ptime->second = (png_byte)ptVar1->tm_sec;
  return;
}

Assistant:

void PNGAPI
png_convert_from_time_t(png_timep ptime, time_t ttime)
{
   struct tm *tbuf;

   png_debug(1, "in png_convert_from_time_t");

   tbuf = gmtime(&ttime);
   png_convert_from_struct_tm(ptime, tbuf);
}